

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_rds_describe_regions.cc
# Opt level: O2

int __thiscall
aliyun::Rds::DescribeRegions
          (Rds *this,RdsDescribeRegionsRequestType *req,RdsDescribeRegionsResponseType *response,
          RdsErrorInfo *error_info)

{
  bool bVar1;
  int iVar2;
  ArrayIndex AVar3;
  AliRpcRequest *this_00;
  Value *pVVar4;
  Value *pVVar5;
  Value *this_01;
  char *pcVar6;
  uint index;
  allocator<char> local_464;
  allocator<char> local_463;
  allocator<char> local_462;
  allocator<char> local_461;
  Value val;
  undefined1 local_448 [32];
  _Alloc_hider local_428;
  size_type local_420;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_418;
  vector<aliyun::RdsDescribeRegionsRDSRegionType,_std::allocator<aliyun::RdsDescribeRegionsRDSRegionType>_>
  *local_408;
  string str_response;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string secheme;
  string local_160;
  Reader reader;
  
  str_response._M_dataplus._M_p = (pointer)&str_response.field_2;
  str_response._M_string_length = 0;
  str_response.field_2._M_local_buf[0] = '\0';
  pcVar6 = "http";
  if (this->use_tls_ != false) {
    pcVar6 = "https";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&secheme,pcVar6,(allocator<char> *)&reader);
  this_00 = (AliRpcRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,this->version_,(allocator<char> *)local_448);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,this->appid_,(allocator<char> *)&local_160);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e0,this->secret_,(allocator<char> *)&val);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 &secheme,"://");
  std::operator+(&local_200,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 this->host_);
  AliRpcRequest::AliRpcRequest(this_00,&local_1a0,&local_1c0,&local_1e0,&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&reader);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1a0);
  if (((this->use_tls_ == false) && (pcVar6 = this->proxy_host_, pcVar6 != (char *)0x0)) &&
     (*pcVar6 != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_220,pcVar6,(allocator<char> *)&reader);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_220);
    std::__cxx11::string::~string((string *)&local_220);
  }
  Json::Value::Value(&val,nullValue);
  Json::Reader::Reader(&reader);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_240,"Action",(allocator<char> *)local_448);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_260,"DescribeRegions",(allocator<char> *)&local_160);
  AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_240,&local_260);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_240);
  if ((req->owner_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_280,"OwnerId",(allocator<char> *)local_448);
    std::__cxx11::string::string((string *)&local_2a0,(string *)req);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_280,&local_2a0);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_280);
  }
  if ((req->resource_owner_account)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2c0,"ResourceOwnerAccount",(allocator<char> *)local_448);
    std::__cxx11::string::string((string *)&local_2e0,(string *)&req->resource_owner_account);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2c0,&local_2e0);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::__cxx11::string::~string((string *)&local_2c0);
  }
  if ((req->resource_owner_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_300,"ResourceOwnerId",(allocator<char> *)local_448);
    std::__cxx11::string::string((string *)&local_320,(string *)&req->resource_owner_id);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_300,&local_320);
    std::__cxx11::string::~string((string *)&local_320);
    std::__cxx11::string::~string((string *)&local_300);
  }
  if ((req->client_token)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_340,"ClientToken",(allocator<char> *)local_448);
    std::__cxx11::string::string((string *)&local_360,(string *)&req->client_token);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_340,&local_360);
    std::__cxx11::string::~string((string *)&local_360);
    std::__cxx11::string::~string((string *)&local_340);
  }
  if ((req->owner_account)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_380,"OwnerAccount",(allocator<char> *)local_448);
    std::__cxx11::string::string((string *)&local_3a0,(string *)&req->owner_account);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_380,&local_3a0);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::__cxx11::string::~string((string *)&local_380);
  }
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3c0,"RegionId",(allocator<char> *)local_448);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3e0,this->region_id_,(allocator<char> *)&local_160);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_3c0,&local_3e0);
    std::__cxx11::string::~string((string *)&local_3e0);
    std::__cxx11::string::~string((string *)&local_3c0);
  }
  iVar2 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar2 == 0) {
    iVar2 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&str_response);
    if (((0 < iVar2) && (str_response._M_string_length != 0)) &&
       (bVar1 = Json::Reader::parse(&reader,&str_response,&val,true), bVar1)) {
      if (error_info != (RdsErrorInfo *)0x0 && iVar2 != 200) {
        bVar1 = Json::Value::isMember(&val,"RequestId");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"RequestId");
          Json::Value::asString_abi_cxx11_((string *)local_448,pVVar4);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_448,anon_var_dwarf_2e8ef7 + 9,&local_461);
        }
        std::__cxx11::string::operator=((string *)error_info,(string *)local_448);
        std::__cxx11::string::~string((string *)local_448);
        bVar1 = Json::Value::isMember(&val,"Code");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"Code");
          Json::Value::asString_abi_cxx11_((string *)local_448,pVVar4);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_448,anon_var_dwarf_2e8ef7 + 9,&local_462);
        }
        std::__cxx11::string::operator=((string *)&error_info->code,(string *)local_448);
        std::__cxx11::string::~string((string *)local_448);
        bVar1 = Json::Value::isMember(&val,"HostId");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"HostId");
          Json::Value::asString_abi_cxx11_((string *)local_448,pVVar4);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_448,anon_var_dwarf_2e8ef7 + 9,&local_463);
        }
        std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)local_448);
        std::__cxx11::string::~string((string *)local_448);
        bVar1 = Json::Value::isMember(&val,"Message");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"Message");
          Json::Value::asString_abi_cxx11_((string *)local_448,pVVar4);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_448,anon_var_dwarf_2e8ef7 + 9,&local_464);
        }
        std::__cxx11::string::operator=((string *)&error_info->message,(string *)local_448);
        std::__cxx11::string::~string((string *)local_448);
      }
      if (response != (RdsDescribeRegionsResponseType *)0x0 && iVar2 == 200) {
        bVar1 = Json::Value::isMember(&val,"Regions");
        iVar2 = 200;
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"Regions");
          bVar1 = Json::Value::isMember(pVVar4,"RDSRegion");
          if (bVar1) {
            pVVar4 = Json::Value::operator[](&val,"Regions");
            pVVar4 = Json::Value::operator[](pVVar4,"RDSRegion");
            bVar1 = Json::Value::isArray(pVVar4);
            if (bVar1) {
              index = 0;
              local_408 = &response->regions;
              for (; AVar3 = Json::Value::size(pVVar4), index < AVar3; index = index + 1) {
                local_448._0_8_ = local_448 + 0x10;
                local_448._8_8_ = 0;
                local_448[0x10] = '\0';
                local_428._M_p = (pointer)&local_418;
                local_420 = 0;
                local_418._M_local_buf[0] = '\0';
                pVVar5 = Json::Value::operator[](pVVar4,index);
                bVar1 = Json::Value::isMember(pVVar5,"RegionId");
                if (bVar1) {
                  this_01 = Json::Value::operator[](pVVar5,"RegionId");
                  Json::Value::asString_abi_cxx11_(&local_160,this_01);
                  std::__cxx11::string::operator=((string *)local_448,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar5,"ZoneId");
                if (bVar1) {
                  pVVar5 = Json::Value::operator[](pVVar5,"ZoneId");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar5);
                  std::__cxx11::string::operator=((string *)&local_428,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                std::
                vector<aliyun::RdsDescribeRegionsRDSRegionType,_std::allocator<aliyun::RdsDescribeRegionsRDSRegionType>_>
                ::push_back(local_408,(value_type *)local_448);
                RdsDescribeRegionsRDSRegionType::~RdsDescribeRegionsRDSRegionType
                          ((RdsDescribeRegionsRDSRegionType *)local_448);
              }
            }
          }
        }
      }
      goto LAB_001816e6;
    }
  }
  iVar2 = -1;
  if (error_info != (RdsErrorInfo *)0x0) {
    std::__cxx11::string::assign((char *)&error_info->code);
  }
LAB_001816e6:
  AliRpcRequest::~AliRpcRequest(this_00);
  operator_delete(this_00,0x2c8);
  Json::Reader::~Reader(&reader);
  Json::Value::~Value(&val);
  std::__cxx11::string::~string((string *)&secheme);
  std::__cxx11::string::~string((string *)&str_response);
  return iVar2;
}

Assistant:

int Rds::DescribeRegions(const RdsDescribeRegionsRequestType& req,
                      RdsDescribeRegionsResponseType* response,
                       RdsErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","DescribeRegions");
  if(!req.owner_id.empty()) {
    req_rpc->AddRequestQuery("OwnerId", req.owner_id);
  }
  if(!req.resource_owner_account.empty()) {
    req_rpc->AddRequestQuery("ResourceOwnerAccount", req.resource_owner_account);
  }
  if(!req.resource_owner_id.empty()) {
    req_rpc->AddRequestQuery("ResourceOwnerId", req.resource_owner_id);
  }
  if(!req.client_token.empty()) {
    req_rpc->AddRequestQuery("ClientToken", req.client_token);
  }
  if(!req.owner_account.empty()) {
    req_rpc->AddRequestQuery("OwnerAccount", req.owner_account);
  }
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}